

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc_map.h
# Opt level: O0

bool __thiscall skiwi::reg_alloc_data::operator<(reg_alloc_data *this,reg_alloc_data *other)

{
  reg_alloc_data *other_local;
  reg_alloc_data *this_local;
  
  if (this->type == other->type) {
    if (this->type == t_local) {
      this_local._7_1_ = this->local_id < other->local_id;
    }
    else {
      this_local._7_1_ = (int)this->reg < (int)other->reg;
    }
  }
  else {
    this_local._7_1_ = (int)this->type < (int)other->type;
  }
  return this_local._7_1_;
}

Assistant:

bool operator < (const reg_alloc_data& other) const
    {
    if (type == other.type)
      {
      if (type == reg_alloc_data::t_local)
        return local_id < other.local_id;
      else
        return (int)reg < (int)other.reg;
      }
    else
      return (int)type < (int)other.type;
    }